

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::generateOperation
          (IMC_Generator *this,OperationCombination comb,HexOp op_val,HexOp op_const,HexOp op_atr0,
          shared_ptr<nigel::IM_Operator> *lOp,shared_ptr<nigel::IM_Operator> *rOp,
          shared_ptr<nigel::Token> *token)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  HexOp HVar3;
  bool bVar4;
  element_type *peVar5;
  bool bVar6;
  bool local_f61;
  bool local_ef9;
  bool local_eb9;
  shared_ptr<nigel::IM_Operator> local_c48;
  shared_ptr<nigel::IM_SFR> local_c38;
  shared_ptr<nigel::IM_Operator> local_c28;
  shared_ptr<nigel::IM_Operator> local_c18;
  shared_ptr<nigel::IM_Operator> local_c08;
  shared_ptr<nigel::IM_Operator> local_bf8;
  shared_ptr<nigel::IM_Operator> local_be8;
  shared_ptr<nigel::IM_Operator> local_bd8;
  IM_Operator local_bc8;
  shared_ptr<nigel::IM_SFR> local_ba8;
  shared_ptr<nigel::IM_Operator> local_b98;
  shared_ptr<nigel::IM_Operator> local_b88;
  shared_ptr<nigel::IM_SFR> local_b78;
  shared_ptr<nigel::IM_Operator> local_b68;
  shared_ptr<nigel::IM_Operator> local_b58;
  shared_ptr<nigel::IM_Operator> local_b48;
  shared_ptr<nigel::IM_Operator> local_b38;
  shared_ptr<nigel::IM_Operator> local_b28;
  shared_ptr<nigel::IM_Operator> local_b18;
  shared_ptr<nigel::IM_SFR> local_b08;
  shared_ptr<nigel::IM_Operator> local_af8;
  IM_Operator local_ae8;
  shared_ptr<nigel::IM_Operator> local_ac8;
  IM_Operator local_ab8;
  shared_ptr<nigel::IM_SFR> local_a98;
  shared_ptr<nigel::IM_Operator> local_a88;
  shared_ptr<nigel::IM_Operator> local_a78;
  shared_ptr<nigel::IM_Operator> local_a68;
  shared_ptr<nigel::IM_Operator> local_a58;
  shared_ptr<nigel::IM_Operator> local_a48;
  shared_ptr<nigel::IM_Operator> local_a38;
  shared_ptr<nigel::IM_Operator> local_a28;
  shared_ptr<nigel::Token> local_a18;
  shared_ptr<nigel::IM_Operator> local_a08;
  shared_ptr<nigel::IM_Operator> local_9f8;
  shared_ptr<nigel::IM_Operator> local_9e8;
  shared_ptr<nigel::IM_Operator> local_9d8;
  shared_ptr<nigel::IM_Operator> local_9c8;
  IM_Operator local_9b8;
  shared_ptr<nigel::IM_SFR> local_998;
  shared_ptr<nigel::IM_Operator> local_988;
  shared_ptr<nigel::IM_Operator> local_978;
  shared_ptr<nigel::IM_Operator> local_968;
  shared_ptr<nigel::IM_Operator> local_958;
  shared_ptr<nigel::IM_SFR> local_948;
  shared_ptr<nigel::IM_Operator> local_938;
  shared_ptr<nigel::IM_Operator> local_928;
  shared_ptr<nigel::IM_Operator> local_918;
  shared_ptr<nigel::IM_Operator> local_908;
  shared_ptr<nigel::IM_Operator> local_8f8;
  IM_Operator local_8e8;
  shared_ptr<nigel::IM_Operator> local_8c8;
  shared_ptr<nigel::IM_Operator> local_8b8;
  shared_ptr<nigel::IM_Operator> local_8a8;
  IM_Operator local_898;
  shared_ptr<nigel::IM_SFR> local_878;
  shared_ptr<nigel::IM_Operator> local_868;
  shared_ptr<nigel::IM_Operator> local_858;
  shared_ptr<nigel::IM_Operator> local_848;
  shared_ptr<nigel::IM_Operator> local_838;
  IM_Operator local_828;
  shared_ptr<nigel::IM_SFR> local_808;
  shared_ptr<nigel::IM_Operator> local_7f8;
  shared_ptr<nigel::IM_Operator> local_7e8;
  shared_ptr<nigel::IM_Operator> local_7d8;
  shared_ptr<nigel::IM_Operator> local_7c8;
  shared_ptr<nigel::IM_Operator> local_7b8;
  IM_Operator local_7a8;
  shared_ptr<nigel::IM_SFR> local_788;
  shared_ptr<nigel::IM_Operator> local_778;
  shared_ptr<nigel::IM_Operator> local_768;
  shared_ptr<nigel::IM_Operator> local_758;
  IM_Operator local_748;
  shared_ptr<nigel::IM_Operator> local_728;
  shared_ptr<nigel::IM_Operator> local_718;
  shared_ptr<nigel::IM_Operator> local_708;
  shared_ptr<nigel::IM_Operator> local_6f8;
  IM_Operator local_6e8;
  shared_ptr<nigel::IM_Operator> local_6c8;
  shared_ptr<nigel::IM_Operator> local_6b8;
  shared_ptr<nigel::IM_Operator> local_6a8;
  shared_ptr<nigel::IM_Operator> local_698;
  shared_ptr<nigel::IM_Operator> local_688;
  IM_Operator local_678;
  shared_ptr<nigel::IM_Operator> local_658;
  shared_ptr<nigel::IM_Operator> local_648;
  shared_ptr<nigel::IM_Operator> local_638;
  IM_Operator local_628;
  shared_ptr<nigel::IM_Operator> local_608;
  shared_ptr<nigel::IM_Operator> local_5f8;
  shared_ptr<nigel::IM_Operator> local_5e8;
  shared_ptr<nigel::IM_Operator> local_5d8;
  shared_ptr<nigel::IM_Operator> local_5c8;
  byte local_5b1;
  undefined1 local_5b0 [32];
  shared_ptr<nigel::IM_Operator> local_590;
  shared_ptr<nigel::IM_Operator> local_580;
  shared_ptr<nigel::IM_Operator> local_570;
  shared_ptr<nigel::IM_Operator> local_560;
  shared_ptr<nigel::IM_Operator> local_550;
  shared_ptr<nigel::IM_Operator> local_540;
  shared_ptr<nigel::IM_Operator> local_530;
  byte local_519;
  undefined1 local_518 [16];
  IM_Operator local_508;
  shared_ptr<nigel::IM_Operator> local_4e8;
  shared_ptr<nigel::IM_Operator> local_4d8;
  shared_ptr<nigel::IM_Operator> local_4c8;
  shared_ptr<nigel::IM_Operator> local_4b8;
  byte local_4a1;
  undefined1 local_4a0 [16];
  IM_Operator local_490;
  shared_ptr<nigel::IM_SFR> local_470;
  shared_ptr<nigel::IM_Operator> local_460;
  shared_ptr<nigel::IM_Operator> local_450;
  shared_ptr<nigel::IM_Operator> local_440;
  shared_ptr<nigel::IM_Operator> local_430;
  shared_ptr<nigel::IM_SFR> local_420;
  shared_ptr<nigel::IM_Operator> local_410;
  shared_ptr<nigel::IM_Operator> local_400;
  shared_ptr<nigel::IM_Operator> local_3f0;
  shared_ptr<nigel::IM_Operator> local_3e0;
  shared_ptr<nigel::IM_Operator> local_3d0;
  shared_ptr<nigel::IM_Operator> local_3c0;
  byte local_3a9;
  undefined1 local_3a8 [32];
  shared_ptr<nigel::IM_Operator> local_388;
  shared_ptr<nigel::IM_SFR> local_378;
  shared_ptr<nigel::IM_Operator> local_368;
  shared_ptr<nigel::IM_Operator> local_358;
  shared_ptr<nigel::IM_Operator> local_348;
  shared_ptr<nigel::IM_Operator> local_338;
  shared_ptr<nigel::IM_Operator> local_328;
  shared_ptr<nigel::IM_Operator> local_318;
  shared_ptr<nigel::IM_SFR> local_308;
  shared_ptr<nigel::IM_Operator> local_2f8;
  shared_ptr<nigel::IM_Operator> local_2e8;
  shared_ptr<nigel::IM_Operator> local_2d8;
  shared_ptr<nigel::IM_Operator> local_2c8;
  shared_ptr<nigel::IM_Operator> local_2b8;
  byte local_2a1;
  undefined1 local_2a0 [16];
  IM_Operator local_290;
  shared_ptr<nigel::IM_SFR> local_270;
  shared_ptr<nigel::IM_Operator> local_260;
  shared_ptr<nigel::IM_Operator> local_250;
  shared_ptr<nigel::IM_Operator> local_240;
  shared_ptr<nigel::IM_Operator> local_230;
  shared_ptr<nigel::IM_SFR> local_220;
  shared_ptr<nigel::IM_Operator> local_210;
  shared_ptr<nigel::IM_Operator> local_200;
  shared_ptr<nigel::IM_Operator> local_1f0;
  shared_ptr<nigel::IM_Operator> local_1e0;
  shared_ptr<nigel::IM_Operator> local_1d0;
  byte local_1b9;
  undefined1 local_1b8 [16];
  IM_Operator local_1a8;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  shared_ptr<nigel::IM_Operator> local_158;
  byte local_141;
  undefined1 local_140 [32];
  shared_ptr<nigel::IM_Operator> local_120;
  shared_ptr<nigel::IM_Operator> local_110;
  shared_ptr<nigel::IM_Operator> local_100;
  shared_ptr<nigel::IM_Operator> local_f0;
  shared_ptr<nigel::IM_Operator> local_e0;
  shared_ptr<nigel::IM_Operator> local_d0;
  byte local_b9;
  undefined1 local_b8 [16];
  IM_Operator local_a8;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  byte local_55;
  undefined1 local_48 [16];
  undefined1 local_38 [24];
  shared_ptr<nigel::IM_Operator> *lOp_local;
  HexOp op_atr0_local;
  HexOp op_const_local;
  HexOp op_val_local;
  OperationCombination comb_local;
  IMC_Generator *this_local;
  
  local_38._16_8_ = lOp;
  lOp_local._0_4_ = op_atr0;
  lOp_local._4_4_ = op_const;
  op_atr0_local = op_val;
  op_const_local = comb;
  _op_val_local = this;
  if (comb == vv) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               lOp);
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_38);
    peVar5 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    local_55 = 0;
    bVar6 = false;
    if (*(int *)&(peVar5->super_IM_Operator).field_0x1c == 0) {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)rOp);
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_48);
      local_55 = 1;
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      bVar6 = *(int *)&(peVar5->super_IM_Operator).field_0x1c == 0;
    }
    if ((local_55 & 1) != 0) {
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_48);
    }
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_38);
    if (bVar6) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_68,lOp);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_78,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_68,&local_78);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_78);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_68);
      HVar3 = op_atr0_local;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_88,rOp);
      p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                       super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,HVar3,&local_88,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 ((long)&local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                         super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8));
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_88);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)lOp);
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_b8 + 0x10));
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(local_b8 + 0x10));
      local_b9 = 0;
      bVar6 = false;
      if (*(int *)&(peVar5->super_IM_Operator).field_0x1c == 1) {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)rOp);
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_b8);
        local_b9 = 1;
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b8);
        bVar6 = *(int *)&(peVar5->super_IM_Operator).field_0x1c == 0;
      }
      if ((local_b9 & 1) != 0) {
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_b8)
        ;
      }
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                ((shared_ptr<nigel::IM_Variable> *)(local_b8 + 0x10));
      if (bVar6) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_d0,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_e0,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_d0,&local_e0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_e0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_d0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_f0,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_100,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_f0,&local_100);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_100);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_f0);
        HVar3 = op_atr0_local;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_110,rOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_120,(nullptr_t)0x0);
        addCmd(this,HVar3,&local_110,&local_120);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_120);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_110);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)lOp);
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_140 + 0x10));
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(local_140 + 0x10));
        local_141 = 0;
        bVar4 = IM_Variable::isOnStack(peVar5);
        bVar6 = false;
        if (bVar4) {
          std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)rOp);
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_140);
          local_141 = 1;
          peVar5 = std::
                   __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_140);
          bVar6 = *(int *)&(peVar5->super_IM_Operator).field_0x1c == 0;
        }
        if ((local_141 & 1) != 0) {
          std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                    ((shared_ptr<nigel::IM_Variable> *)local_140);
        }
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)(local_140 + 0x10));
        if (bVar6) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_158,lOp);
          generateLoadStackR0(this,&local_158);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_158);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_168,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_178,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_168,&local_178);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_178);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_168);
          HVar3 = op_atr0_local;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_188,rOp);
          p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_1a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                           super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
          addCmd(this,HVar3,&local_188,(shared_ptr<nigel::IM_Operator> *)p_Var1);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)
                     ((long)&local_1a8.super_enable_shared_from_this<nigel::IM_Operator>.
                             _M_weak_this.
                             super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8));
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_188);
        }
        else {
          std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)lOp);
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_1b8 + 0x10));
          peVar5 = std::
                   __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(local_1b8 + 0x10));
          local_1b9 = 0;
          bVar6 = false;
          if (*(int *)&(peVar5->super_IM_Operator).field_0x1c == 0) {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)rOp);
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_1b8);
            local_1b9 = 1;
            peVar5 = std::
                     __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1b8);
            bVar6 = *(int *)&(peVar5->super_IM_Operator).field_0x1c == 1;
          }
          if ((local_1b9 & 1) != 0) {
            std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                      ((shared_ptr<nigel::IM_Variable> *)local_1b8);
          }
          std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                    ((shared_ptr<nigel::IM_Variable> *)(local_1b8 + 0x10));
          if (bVar6) {
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1d0,rOp);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1e0,(nullptr_t)0x0);
            addCmd(this,mov_dptr_const,&local_1d0,&local_1e0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1e0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1d0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1f0,(nullptr_t)0x0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_200,(nullptr_t)0x0);
            addCmd(this,movx_a_dptr,&local_1f0,&local_200);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_200);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1f0);
            IM_SFR::getSFR((SFR)&local_220);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                      (&local_210,&local_220);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_230,(nullptr_t)0x0);
            addCmd(this,mov_adr_a,&local_210,&local_230);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_230);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_210);
            std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_220);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_240,lOp);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_250,(nullptr_t)0x0);
            addCmd(this,mov_a_adr,&local_240,&local_250);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_250);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_240);
            HVar3 = op_atr0_local;
            IM_SFR::getSFR((SFR)&local_270);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                      (&local_260,&local_270);
            p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&local_290.super_enable_shared_from_this<nigel::IM_Operator>.
                             _M_weak_this.
                             super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr
                      ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
            addCmd(this,HVar3,&local_260,(shared_ptr<nigel::IM_Operator> *)p_Var1);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                      ((shared_ptr<nigel::IM_Operator> *)
                       ((long)&local_290.super_enable_shared_from_this<nigel::IM_Operator>.
                               _M_weak_this.
                               super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8)
                      );
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_260);
            std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_270);
          }
          else {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)lOp);
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_2a0 + 0x10));
            peVar5 = std::
                     __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(local_2a0 + 0x10));
            local_2a1 = 0;
            bVar6 = false;
            if (*(int *)&(peVar5->super_IM_Operator).field_0x1c == 1) {
              std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)rOp);
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_2a0);
              local_2a1 = 1;
              peVar5 = std::
                       __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2a0);
              bVar6 = *(int *)&(peVar5->super_IM_Operator).field_0x1c == 1;
            }
            if ((local_2a1 & 1) != 0) {
              std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                        ((shared_ptr<nigel::IM_Variable> *)local_2a0);
            }
            std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                      ((shared_ptr<nigel::IM_Variable> *)(local_2a0 + 0x10));
            if (bVar6) {
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2b8,rOp);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2c8,(nullptr_t)0x0);
              addCmd(this,mov_dptr_const,&local_2b8,&local_2c8);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2c8);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2b8);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2d8,(nullptr_t)0x0);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2e8,(nullptr_t)0x0);
              addCmd(this,movx_a_dptr,&local_2d8,&local_2e8);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2e8);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2d8);
              IM_SFR::getSFR((SFR)&local_308);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                        (&local_2f8,&local_308);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_318,(nullptr_t)0x0);
              addCmd(this,mov_adr_a,&local_2f8,&local_318);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_318);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2f8);
              std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_308);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_328,lOp);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_338,(nullptr_t)0x0);
              addCmd(this,mov_dptr_const,&local_328,&local_338);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_338);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_328);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_348,(nullptr_t)0x0);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_358,(nullptr_t)0x0);
              addCmd(this,movx_a_dptr,&local_348,&local_358);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_358);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_348);
              HVar3 = op_atr0_local;
              IM_SFR::getSFR((SFR)&local_378);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                        (&local_368,&local_378);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_388,(nullptr_t)0x0);
              addCmd(this,HVar3,&local_368,&local_388);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_388);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_368);
              std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_378);
            }
            else {
              std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)lOp);
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_3a8 + 0x10));
              peVar5 = std::
                       __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(local_3a8 + 0x10));
              local_3a9 = 0;
              bVar4 = IM_Variable::isOnStack(peVar5);
              bVar6 = false;
              if (bVar4) {
                std::
                __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)rOp);
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_3a8);
                local_3a9 = 1;
                peVar5 = std::
                         __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_3a8);
                bVar6 = *(int *)&(peVar5->super_IM_Operator).field_0x1c == 1;
              }
              if ((local_3a9 & 1) != 0) {
                std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                          ((shared_ptr<nigel::IM_Variable> *)local_3a8);
              }
              std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                        ((shared_ptr<nigel::IM_Variable> *)(local_3a8 + 0x10));
              if (bVar6) {
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3c0,lOp);
                generateLoadStackR0(this,&local_3c0);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3c0);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3d0,rOp);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3e0,(nullptr_t)0x0);
                addCmd(this,mov_dptr_const,&local_3d0,&local_3e0);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3e0);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3d0);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3f0,(nullptr_t)0x0);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_400,(nullptr_t)0x0);
                addCmd(this,movx_a_dptr,&local_3f0,&local_400);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_400);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3f0);
                IM_SFR::getSFR((SFR)&local_420);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                          (&local_410,&local_420);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_430,(nullptr_t)0x0);
                addCmd(this,mov_adr_a,&local_410,&local_430);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_430);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_410);
                std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_420);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_440,(nullptr_t)0x0);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_450,(nullptr_t)0x0);
                addCmd(this,mov_a_atr0,&local_440,&local_450);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_450);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_440);
                HVar3 = op_atr0_local;
                IM_SFR::getSFR((SFR)&local_470);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                          (&local_460,&local_470);
                p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&local_490.super_enable_shared_from_this<nigel::IM_Operator>.
                                 _M_weak_this.
                                 super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> +
                         8);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr
                          ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
                addCmd(this,HVar3,&local_460,(shared_ptr<nigel::IM_Operator> *)p_Var1);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                          ((shared_ptr<nigel::IM_Operator> *)
                           ((long)&local_490.super_enable_shared_from_this<nigel::IM_Operator>.
                                   _M_weak_this.
                                   super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                           + 8));
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_460);
                std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_470);
              }
              else {
                std::
                __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)lOp);
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_4a0 + 0x10));
                peVar5 = std::
                         __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)(local_4a0 + 0x10));
                local_4a1 = 0;
                local_eb9 = false;
                if (*(int *)&(peVar5->super_IM_Operator).field_0x1c == 0) {
                  std::
                  __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)rOp);
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_4a0);
                  local_4a1 = 1;
                  peVar5 = std::
                           __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_4a0);
                  local_eb9 = IM_Variable::isOnStack(peVar5);
                }
                if ((local_4a1 & 1) != 0) {
                  std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                            ((shared_ptr<nigel::IM_Variable> *)local_4a0);
                }
                std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                          ((shared_ptr<nigel::IM_Variable> *)(local_4a0 + 0x10));
                if (local_eb9 == false) {
                  std::
                  __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)lOp);
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_518 + 0x10));
                  peVar5 = std::
                           __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)(local_518 + 0x10));
                  local_519 = 0;
                  local_ef9 = false;
                  if (*(int *)&(peVar5->super_IM_Operator).field_0x1c == 1) {
                    std::
                    __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)rOp);
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_518);
                    local_519 = 1;
                    peVar5 = std::
                             __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_518);
                    local_ef9 = IM_Variable::isOnStack(peVar5);
                  }
                  if ((local_519 & 1) != 0) {
                    std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                              ((shared_ptr<nigel::IM_Variable> *)local_518);
                  }
                  std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                            ((shared_ptr<nigel::IM_Variable> *)(local_518 + 0x10));
                  if (local_ef9 == false) {
                    std::
                    __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)lOp);
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_5b0 + 0x10));
                    peVar5 = std::
                             __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)(local_5b0 + 0x10));
                    local_5b1 = 0;
                    bVar6 = IM_Variable::isOnStack(peVar5);
                    local_f61 = false;
                    if (bVar6) {
                      std::
                      __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)rOp);
                      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_5b0);
                      local_5b1 = 1;
                      peVar5 = std::
                               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_5b0);
                      local_f61 = IM_Variable::isOnStack(peVar5);
                    }
                    if ((local_5b1 & 1) != 0) {
                      std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                                ((shared_ptr<nigel::IM_Variable> *)local_5b0);
                    }
                    std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                              ((shared_ptr<nigel::IM_Variable> *)(local_5b0 + 0x10));
                    if (local_f61 != false) {
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5c8,rOp);
                      generateLoadStackR0(this,&local_5c8);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5c8);
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5d8,lOp);
                      generateLoadStackR1(this,&local_5d8);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5d8);
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5e8,(nullptr_t)0x0);
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5f8,(nullptr_t)0x0);
                      addCmd(this,mov_a_atr1,&local_5e8,&local_5f8);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5f8);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5e8);
                      HVar3 = (HexOp)lOp_local;
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_608,(nullptr_t)0x0);
                      p_Var1 = &local_628.super_enable_shared_from_this<nigel::IM_Operator>.
                                _M_weak_this.
                                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount;
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
                      addCmd(this,HVar3,&local_608,(shared_ptr<nigel::IM_Operator> *)p_Var1);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                ((shared_ptr<nigel::IM_Operator> *)
                                 &local_628.super_enable_shared_from_this<nigel::IM_Operator>.
                                  _M_weak_this.
                                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_608);
                    }
                  }
                  else {
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_530,rOp);
                    generateLoadStackR0(this,&local_530);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_530);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_540,lOp);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_550,(nullptr_t)0x0);
                    addCmd(this,mov_dptr_const,&local_540,&local_550);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_550);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_540);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_560,(nullptr_t)0x0);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_570,(nullptr_t)0x0);
                    addCmd(this,movx_a_dptr,&local_560,&local_570);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_570);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_560);
                    HVar3 = (HexOp)lOp_local;
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_580,(nullptr_t)0x0);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_590,(nullptr_t)0x0);
                    addCmd(this,HVar3,&local_580,&local_590);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_590);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_580);
                  }
                }
                else {
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4b8,rOp);
                  generateLoadStackR0(this,&local_4b8);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4b8);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4c8,lOp);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4d8,(nullptr_t)0x0);
                  addCmd(this,mov_a_adr,&local_4c8,&local_4d8);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4d8);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4c8);
                  HVar3 = (HexOp)lOp_local;
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4e8,(nullptr_t)0x0);
                  p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&local_508.super_enable_shared_from_this<nigel::IM_Operator>.
                                   _M_weak_this.
                                   super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                           + 8);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                            ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
                  addCmd(this,HVar3,&local_4e8,(shared_ptr<nigel::IM_Operator> *)p_Var1);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                            ((shared_ptr<nigel::IM_Operator> *)
                             ((long)&local_508.super_enable_shared_from_this<nigel::IM_Operator>.
                                     _M_weak_this.
                                     super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                             + 8));
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4e8);
                }
              }
            }
          }
        }
      }
    }
  }
  else if (comb == vc) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               lOp);
    IM_Operator::as<nigel::IM_Variable>(&local_628);
    peVar5 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_628);
    iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_628);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_638,lOp);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_648,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_638,&local_648);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_648);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_638);
      HVar3 = lOp_local._4_4_;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_658,rOp);
      p_Var1 = &local_678.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,HVar3,&local_658,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_678.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_658);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)lOp);
      IM_Operator::as<nigel::IM_Variable>(&local_678);
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_678);
      iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_678)
      ;
      if (iVar2 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_688,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_698,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_688,&local_698);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_698);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_688);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6a8,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6b8,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_6a8,&local_6b8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6b8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6a8);
        HVar3 = lOp_local._4_4_;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6c8,rOp);
        p_Var1 = &local_6e8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,HVar3,&local_6c8,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_6e8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6c8);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)lOp);
        IM_Operator::as<nigel::IM_Variable>(&local_6e8);
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_6e8);
        bVar6 = IM_Variable::isOnStack(peVar5);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_6e8);
        if (bVar6) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6f8,lOp);
          generateLoadStackR0(this,&local_6f8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6f8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_708,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_718,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_708,&local_718);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_718);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_708);
          HVar3 = lOp_local._4_4_;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_728,rOp);
          p_Var1 = &local_748.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
          addCmd(this,HVar3,&local_728,(shared_ptr<nigel::IM_Operator> *)p_Var1);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)
                     &local_748.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                      super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_728);
        }
      }
    }
  }
  else if (comb == vt) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               lOp);
    IM_Operator::as<nigel::IM_Variable>(&local_748);
    peVar5 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_748);
    iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_748);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_758,lOp);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_768,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_758,&local_768);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_768);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_758);
      HVar3 = op_atr0_local;
      IM_SFR::getSFR((SFR)&local_788);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_778,&local_788);
      p_Var1 = &local_7a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,HVar3,&local_778,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_7a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_778);
      std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_788);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)lOp);
      IM_Operator::as<nigel::IM_Variable>(&local_7a8);
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_7a8);
      iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_7a8)
      ;
      if (iVar2 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7b8,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7c8,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_7b8,&local_7c8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7c8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7b8);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7d8,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7e8,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_7d8,&local_7e8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7e8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7d8);
        HVar3 = op_atr0_local;
        IM_SFR::getSFR((SFR)&local_808);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_7f8,&local_808);
        p_Var1 = &local_828.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,HVar3,&local_7f8,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_828.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7f8);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_808);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)lOp);
        IM_Operator::as<nigel::IM_Variable>(&local_828);
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_828);
        bVar6 = IM_Variable::isOnStack(peVar5);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_828);
        if (bVar6) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_838,lOp);
          generateLoadStackR0(this,&local_838);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_838);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_848,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_858,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_848,&local_858);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_858);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_848);
          HVar3 = op_atr0_local;
          IM_SFR::getSFR((SFR)&local_878);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_868,&local_878)
          ;
          p_Var1 = &local_898.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
          addCmd(this,HVar3,&local_868,(shared_ptr<nigel::IM_Operator> *)p_Var1);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)
                     &local_898.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                      super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_868);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_878);
        }
      }
    }
  }
  else if (comb == cv) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               rOp);
    IM_Operator::as<nigel::IM_Variable>(&local_898);
    peVar5 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_898);
    iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_898);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_8a8,lOp);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_8b8,(nullptr_t)0x0);
      addCmd(this,mov_a_const,&local_8a8,&local_8b8);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_8b8);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_8a8);
      HVar3 = op_atr0_local;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_8c8,rOp);
      p_Var1 = &local_8e8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,HVar3,&local_8c8,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_8e8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_8c8);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)rOp);
      IM_Operator::as<nigel::IM_Variable>(&local_8e8);
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_8e8);
      iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_8e8)
      ;
      if (iVar2 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_8f8,rOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_908,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_8f8,&local_908);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_908);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_8f8);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_918,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_928,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_918,&local_928);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_928);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_918);
        IM_SFR::getSFR((SFR)&local_948);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_938,&local_948);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_958,(nullptr_t)0x0);
        addCmd(this,mov_adr_a,&local_938,&local_958);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_958);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_938);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_948);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_968,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_978,(nullptr_t)0x0);
        addCmd(this,mov_a_const,&local_968,&local_978);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_978);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_968);
        HVar3 = op_atr0_local;
        IM_SFR::getSFR((SFR)&local_998);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_988,&local_998);
        p_Var1 = &local_9b8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,HVar3,&local_988,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_9b8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_988);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_998);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)rOp);
        IM_Operator::as<nigel::IM_Variable>(&local_9b8);
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_9b8);
        bVar6 = IM_Variable::isOnStack(peVar5);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_9b8);
        if (bVar6) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9c8,rOp);
          generateLoadStackR0(this,&local_9c8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9c8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9d8,lOp);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9e8,(nullptr_t)0x0);
          addCmd(this,mov_a_const,&local_9d8,&local_9e8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9e8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9d8);
          HVar3 = (HexOp)lOp_local;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9f8,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a08,(nullptr_t)0x0);
          addCmd(this,HVar3,&local_9f8,&local_a08);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a08);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9f8);
        }
      }
    }
  }
  else if (comb == cc) {
    std::shared_ptr<nigel::Token>::shared_ptr(&local_a18,token);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,imp_operationOnTwoConstantsCanBePrevented,&local_a18);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_a18);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a28,lOp);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a38,(nullptr_t)0x0);
    addCmd(this,mov_a_const,&local_a28,&local_a38);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a38);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a28);
    HVar3 = lOp_local._4_4_;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a48,rOp);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a58,(nullptr_t)0x0);
    addCmd(this,HVar3,&local_a48,&local_a58);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a58);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a48);
  }
  else if (comb == ct) {
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a68,lOp);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a78,(nullptr_t)0x0);
    addCmd(this,mov_a_const,&local_a68,&local_a78);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a78);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a68);
    HVar3 = op_atr0_local;
    IM_SFR::getSFR((SFR)&local_a98);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_a88,&local_a98);
    p_Var1 = &local_ab8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
              super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
    addCmd(this,HVar3,&local_a88,(shared_ptr<nigel::IM_Operator> *)p_Var1);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)
               &local_ab8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a88);
    std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_a98);
  }
  else if (comb == tv) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               rOp);
    IM_Operator::as<nigel::IM_Variable>(&local_ab8);
    peVar5 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_ab8);
    iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_ab8);
    HVar3 = op_atr0_local;
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_ac8,rOp);
      p_Var1 = &local_ae8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,HVar3,&local_ac8,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_ae8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_ac8);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)rOp);
      IM_Operator::as<nigel::IM_Variable>(&local_ae8);
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_ae8);
      iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_ae8)
      ;
      if (iVar2 == 1) {
        IM_SFR::getSFR((SFR)&local_b08);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_af8,&local_b08);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b18,(nullptr_t)0x0);
        addCmd(this,xch_a_adr,&local_af8,&local_b18);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b18);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_af8);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_b08);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b28,rOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b38,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_b28,&local_b38);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b38);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b28);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b48,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b58,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_b48,&local_b58);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b58);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b48);
        IM_SFR::getSFR((SFR)&local_b78);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_b68,&local_b78);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b88,(nullptr_t)0x0);
        addCmd(this,xch_a_adr,&local_b68,&local_b88);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b88);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b68);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_b78);
        HVar3 = op_atr0_local;
        IM_SFR::getSFR((SFR)&local_ba8);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_b98,&local_ba8);
        p_Var1 = &local_bc8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,HVar3,&local_b98,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_bc8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b98);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_ba8);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)rOp);
        IM_Operator::as<nigel::IM_Variable>(&local_bc8);
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_bc8);
        bVar6 = IM_Variable::isOnStack(peVar5);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_bc8);
        if (bVar6) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_bd8,rOp);
          generateLoadStackR0(this,&local_bd8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_bd8);
          HVar3 = (HexOp)lOp_local;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_be8,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_bf8,(nullptr_t)0x0);
          addCmd(this,HVar3,&local_be8,&local_bf8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_bf8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_be8);
        }
      }
    }
  }
  else if (comb == tc) {
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_c08,rOp);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_c18,(nullptr_t)0x0);
    addCmd(this,op_const,&local_c08,&local_c18);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_c18);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_c08);
  }
  else if (comb == tt) {
    IM_SFR::getSFR((SFR)&local_c38);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_c28,&local_c38);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_c48,(nullptr_t)0x0);
    addCmd(this,op_val,&local_c28,&local_c48);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_c48);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_c28);
    std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_c38);
  }
  return;
}

Assistant:

void IMC_Generator::generateOperation( OperationCombination comb, HexOp op_val, HexOp op_const, HexOp op_atr0, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp, std::shared_ptr<Token> token )
	{
		if( comb == OC::vv )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_atr0 );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_atr0 );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				generateLoadStackR1( lOp );
				addCmd( HexOp::mov_a_atr1 );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::vc )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_const, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_const, rOp );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_const, rOp );
			}
		}
		else if( comb == OC::vt )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
		}
		else if( comb == OC::cv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_val, rOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::cc )
		{
			generateNotification( NT::imp_operationOnTwoConstantsCanBePrevented, token );
			addCmd( HexOp::mov_a_const, lOp );
			addCmd( op_const, rOp );
		}
		else if( comb == OC::ct )
		{
			addCmd( HexOp::mov_a_const, lOp );
			addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
		}
		else if( comb == OC::tv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( op_val, rOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::xch_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::xch_a_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::tc )
		{
			addCmd( op_const, rOp );
		}
		else if( comb == OC::tt )
		{
			addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
		}
	}